

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValueIndex
          (HtmlparserCppTest *this,string *expected_value_index)

{
  bool bVar1;
  int iVar2;
  int local_1c;
  string *psStack_18;
  int index;
  string *expected_value_index_local;
  HtmlparserCppTest *this_local;
  
  psStack_18 = expected_value_index;
  expected_value_index_local = (string *)this;
  bVar1 = safe_strto32(expected_value_index,&local_1c);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","safe_strto32(expected_value_index, &index)");
    exit(1);
  }
  iVar2 = HtmlParser::ValueIndex(&this->parser_);
  if (local_1c != iVar2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","index","==","parser_.ValueIndex()");
    exit(1);
  }
  return;
}

Assistant:

void HtmlparserCppTest::ValidateValueIndex(const string &expected_value_index) {
  int index;
  CHECK(safe_strto32(expected_value_index, &index));
  EXPECT_EQ(index, parser_.ValueIndex())
      << "Unexpected value_index value at line " << parser_.line_number();
}